

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O1

void absl::lts_20250127::anon_unknown_0::EncodeResult<float>
               (CalculatedFloat *calculated,bool negative,Nonnull<absl::from_chars_result_*> result,
               Nonnull<float_*> value)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  float fVar4;
  
  iVar1 = calculated->exponent;
  if (iVar1 == 99999) {
    result->ec = result_out_of_range;
    if (negative) {
      fVar4 = -3.4028235e+38;
    }
    else {
      fVar4 = 3.4028235e+38;
    }
  }
  else {
    uVar2 = calculated->mantissa;
    if (iVar1 != -99999 && uVar2 != 0) {
      iVar3 = (uint)negative * -0x80000000;
      if ((uint)uVar2 < 0x800000) {
        if (iVar1 != -0x95) {
          __assert_fail("exponent == kMinNormalExponent",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/charconv.cc"
                        ,0xe6,
                        "static float absl::lts_20250127::(anonymous namespace)::FloatTraits<float>::Make(mantissa_t, int, bool)"
                       );
        }
      }
      else {
        iVar3 = iVar3 + iVar1 * 0x800000 + 0x4b000000;
        uVar2 = (ulong)((uint)uVar2 & 0x7fffff);
      }
      *value = (float)(iVar3 + (int)uVar2);
      return;
    }
    result->ec = result_out_of_range;
    if (negative) {
      fVar4 = -0.0;
    }
    else {
      fVar4 = 0.0;
    }
  }
  *value = fVar4;
  return;
}

Assistant:

void EncodeResult(const CalculatedFloat& calculated, bool negative,
                  absl::Nonnull<absl::from_chars_result*> result,
                  absl::Nonnull<FloatType*> value) {
  if (calculated.exponent == kOverflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -std::numeric_limits<FloatType>::max()
                      : std::numeric_limits<FloatType>::max();
    return;
  } else if (calculated.mantissa == 0 || calculated.exponent == kUnderflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -0.0 : 0.0;
    return;
  }
  *value = FloatTraits<FloatType>::Make(
      static_cast<typename FloatTraits<FloatType>::mantissa_t>(
          calculated.mantissa),
      calculated.exponent, negative);
}